

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupRepresentationParser.cpp
# Opt level: O2

vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
* van_kampen::GroupRepresentationParser::parse
            (vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             *__return_storage_ptr__,string *text)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pbVar3;
  long lVar4;
  long lVar5;
  pointer pcVar6;
  invalid_argument *piVar7;
  pointer pbVar8;
  GroupElement local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> element;
  string local_110;
  pointer local_f0;
  pointer local_e8;
  pointer local_e0;
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> curWord;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> word;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> c;
  string local_50 [32];
  
  std::__cxx11::string::find((char *)text,0x161332);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"FreeGroup( ",(allocator<char> *)&local_110);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::find((char *)text,0x16133e);
  pcVar1 = (text->_M_dataplus)._M_p;
  lVar4 = std::__cxx11::string::find((char *)text,0x161342);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"[ ",(allocator<char> *)&local_110);
  lVar4 = local_158.name._M_string_length + lVar4;
  std::__cxx11::string::~string((string *)&local_158);
  pcVar6 = (text->_M_dataplus)._M_p;
  lVar5 = std::__cxx11::string::find((char *)text,0x161345);
  pcVar6 = pcVar6 + lVar5;
  pcVar2 = (text->_M_dataplus)._M_p;
  if ((pcVar2 <= pcVar6) && (pcVar6 <= pcVar2 + text->_M_string_length)) {
    (__return_storage_ptr__->
    super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.name._M_dataplus._M_p = (pointer)&local_158.name.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_158,pcVar1 + lVar4,pcVar6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,", ",(allocator<char> *)&word);
    split_by_delim(&local_a8,&local_158.name,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_158);
    local_f0 = local_a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == local_f0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a8);
        return __return_storage_ptr__;
      }
      local_e8 = local_a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string
                ((string *)&word,
                 (string *)
                 local_a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      curWord.
      super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      curWord.
      super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      curWord.
      super__Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"*",(allocator<char> *)&local_110);
      split_by_delim(&local_c0,&word,&local_158.name);
      std::__cxx11::string::~string((string *)&local_158);
      pbVar3 = local_c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = local_c0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar3; pbVar8 = pbVar8 + 1
          ) {
        std::__cxx11::string::string((string *)&c,(string *)pbVar8);
        std::__cxx11::string::find((char)&c,0x5e);
        std::__cxx11::string::substr((ulong)&element,(ulong)&c);
        if (*element._M_dataplus._M_p == '(') {
          if (element._M_string_length < 2) {
            piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::operator+(&local_110,"can not parse pattern \'",&element);
            std::operator+(&local_158.name,&local_110,"\'");
            std::invalid_argument::invalid_argument(piVar7,(string *)&local_158);
            __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          local_e0 = pbVar8;
          std::__cxx11::string::substr((ulong)local_50,(ulong)&element);
          std::__cxx11::string::operator=((string *)&element,local_50);
          std::__cxx11::string::~string(local_50);
          pbVar8 = local_e0;
        }
        local_158.name._M_string_length = element._M_string_length;
        local_158.reversed = element._M_string_length != c._M_string_length;
        local_158.name._M_dataplus._M_p = element._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)element._M_dataplus._M_p == &element.field_2) {
          local_158.name.field_2._8_8_ = element.field_2._8_8_;
          local_158.name._M_dataplus._M_p = (pointer)&local_158.name.field_2;
        }
        local_158.name.field_2._M_allocated_capacity._1_7_ =
             element.field_2._M_allocated_capacity._1_7_;
        local_158.name.field_2._M_local_buf[0] = element.field_2._M_local_buf[0];
        element._M_string_length = 0;
        element.field_2._M_local_buf[0] = '\0';
        element._M_dataplus._M_p = (pointer)&element.field_2;
        std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::
        emplace_back<van_kampen::GroupElement>(&curWord,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&element);
        std::__cxx11::string::~string((string *)&c);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c0);
      std::
      vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>
      ::emplace_back<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>
                ((vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>
                  *)__return_storage_ptr__,&curWord);
      std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector
                (&curWord);
      std::__cxx11::string::~string((string *)&word);
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_e8 + 1;
    } while( true );
  }
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar7,"invalid group representation format");
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::vector<std::vector<GroupElement>> GroupRepresentationParser::parse(const std::string &text)
{
    auto withoutBorders = [](const std::string &s) {
        if (s.length() < 2)
        {
            throw std::invalid_argument("can not parse pattern '" + s + "'");
        }
        return s.substr(1, s.length() - 2);
    };

    auto alphabetBegin = text.begin() + text.find("FreeGroup( ") + std::string("FreeGroup( ").length();
    auto alphabetEnd = text.begin() + text.find(" );", std::distance(text.begin(), alphabetBegin));

    auto wordsBegin = text.begin() + text.find("[ ", std::distance(text.begin(), alphabetEnd)) + std::string("[ ").length();
    auto wordsEnd = text.begin() + text.find(" ]", std::distance(text.begin(), wordsBegin));

    if (!(text.begin() <= wordsEnd && wordsEnd <= text.end()))
    {
        throw std::invalid_argument("invalid group representation format");
    }

    std::vector<std::vector<van_kampen::GroupElement>> words;

    for (auto word : van_kampen::split_by_delim({wordsBegin, wordsEnd}, ", "))
    {
        std::vector<van_kampen::GroupElement> curWord;
        for (auto c : van_kampen::split_by_delim(word, "*"))
        {
            auto powChar = c.find('^') + c.begin();
            auto element = c.substr(0, powChar - c.begin());
            if (element[0] == '(')
            {
                element = withoutBorders(element);
            }
            bool reversed = element.size() != c.size();
            curWord.emplace_back(GroupElement{std::move(element), reversed});
        }
        words.emplace_back(std::move(curWord));
    }

    return words;
}